

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

string * __thiscall
cmCMakeHostSystemInformationCommand::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakeHostSystemInformationCommand *this,size_t value)

{
  stringstream tmp;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakeHostSystemInformationCommand
::ValueToString(size_t value) const
{
  std::stringstream tmp;
  tmp << value;
  return tmp.str();
}